

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureViewTestViewClasses::initProgramObject
          (TextureViewTestViewClasses *this,GLenum texture_internalformat,GLenum view_internalformat
          )

{
  long lVar1;
  TextureViewTestViewClasses *pTVar2;
  int iVar3;
  uint uVar4;
  _sampler_type _Var5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  char *pcVar8;
  char *pcVar9;
  char *__s;
  ulong uVar10;
  TestError *pTVar11;
  char *__s_00;
  GLint link_status;
  GLint compile_status;
  string vs_body;
  char *vs_body_raw_ptr;
  char *varying_names [2];
  int local_98;
  int local_94;
  char *local_90;
  long *local_88 [2];
  long local_78 [2];
  long local_68;
  char *local_60;
  TextureViewTestViewClasses *local_58;
  long *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_68 = CONCAT44(extraout_var,iVar3);
  uVar4 = TextureViewUtilities::getAmountOfComponentsForInternalformat(texture_internalformat);
  _Var5 = TextureViewUtilities::getSamplerTypeForInternalformat(texture_internalformat);
  pcVar8 = TextureViewUtilities::getGLSLDataTypeForSamplerType(_Var5,uVar4);
  pcVar9 = TextureViewUtilities::getGLSLTypeForSamplerType(_Var5);
  __s_00 = "xyzw";
  local_90 = "xyzw";
  if (uVar4 == 3) {
    __s_00 = "xyz";
  }
  else if ((uVar4 != 4) && (__s_00 = "x", uVar4 == 2)) {
    __s_00 = "xy";
  }
  local_58 = this;
  uVar4 = TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);
  _Var5 = TextureViewUtilities::getSamplerTypeForInternalformat(view_internalformat);
  __s = TextureViewUtilities::getGLSLDataTypeForSamplerType(_Var5,uVar4);
  local_60 = TextureViewUtilities::getGLSLTypeForSamplerType(_Var5);
  if (uVar4 == 3) {
    local_90 = "xyz";
  }
  else if ((uVar4 != 4) && (local_90 = "x", uVar4 == 2)) {
    local_90 = "xy";
  }
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,
             "#version 400\n\nuniform TEXTURE_SAMPLER texture;\nuniform VIEW_SAMPLER    view;\n\nout TEXTURE_DATA_TYPE out_texture_data;\nout VIEW_DATA_TYPE    out_view_data;\n\nvoid main()\n{\n    ivec2 uv = ivec2(gl_VertexID % 4,\n                     gl_VertexID / 4);\n\n    out_texture_data = texelFetch(texture, uv, 0).TEXTURE_SWIZZLE;\n    out_view_data    = texelFetch(view,    uv, 0).VIEW_SWIZZLE;\n}\n"
             ,"");
  while (uVar10 = std::__cxx11::string::find((char *)local_88,0x1ae46b8,0),
        uVar10 != 0xffffffffffffffff) {
    strlen(pcVar8);
    std::__cxx11::string::replace((ulong)local_88,uVar10,(char *)0x11,(ulong)pcVar8);
  }
  while (uVar10 = std::__cxx11::string::find((char *)local_88,0x1ae46ca,0),
        uVar10 != 0xffffffffffffffff) {
    strlen(pcVar9);
    std::__cxx11::string::replace((ulong)local_88,uVar10,(char *)0xf,(ulong)pcVar9);
  }
  while (uVar10 = std::__cxx11::string::find((char *)local_88,0x1ae46da,0), pcVar8 = local_90,
        uVar10 != 0xffffffffffffffff) {
    strlen(__s_00);
    std::__cxx11::string::replace((ulong)local_88,uVar10,(char *)0xf,(ulong)__s_00);
  }
  while (uVar10 = std::__cxx11::string::find((char *)local_88,0x1ae46ea,0), pTVar2 = local_58,
        pcVar9 = local_60, uVar10 != 0xffffffffffffffff) {
    strlen(__s);
    std::__cxx11::string::replace((ulong)local_88,uVar10,(char *)0xe,(ulong)__s);
  }
  while (uVar10 = std::__cxx11::string::find((char *)local_88,0x1ae46f9,0),
        uVar10 != 0xffffffffffffffff) {
    strlen(pcVar9);
    std::__cxx11::string::replace((ulong)local_88,uVar10,(char *)0xc,(ulong)pcVar9);
  }
  while (uVar10 = std::__cxx11::string::find((char *)local_88,0x1ae4706,0), lVar1 = local_68,
        uVar10 != 0xffffffffffffffff) {
    strlen(pcVar8);
    std::__cxx11::string::replace((ulong)local_88,uVar10,(char *)0xc,(ulong)pcVar8);
  }
  local_94 = 0;
  local_50 = local_88[0];
  (**(code **)(local_68 + 0x12b8))(pTVar2->m_vs_id,1,&local_50,0);
  dVar6 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar6,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1ac9);
  (**(code **)(lVar1 + 0x248))(pTVar2->m_vs_id);
  dVar6 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar6,"glCompileShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1acc);
  (**(code **)(lVar1 + 0xa70))(pTVar2->m_vs_id,0x8b81,&local_94);
  dVar6 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar6,"glGetShaderiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1acf);
  if (local_94 != 1) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x1ad3);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_48 = 0x1ae4891;
  uStack_44 = 0;
  uStack_40 = 0x1ae48a2;
  uStack_3c = 0;
  (**(code **)(lVar1 + 0x14c8))(pTVar2->m_po_id,2,&local_48,0x8c8d);
  dVar6 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar6,"glTransformFeedbackVaryings() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1adb);
  (**(code **)(lVar1 + 0x50))(0x8c8e,0,pTVar2->m_bo_id,0,pTVar2->m_view_data_offset);
  (**(code **)(lVar1 + 0x50))
            (0x8c8e,1,pTVar2->m_bo_id,pTVar2->m_view_data_offset,
             pTVar2->m_bo_size - pTVar2->m_view_data_offset);
  dVar6 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar6,"glBindBufferRange() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1ae5);
  local_98 = 0;
  (**(code **)(lVar1 + 0xce8))(pTVar2->m_po_id);
  dVar6 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar6,"glLinkProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1aeb);
  (**(code **)(lVar1 + 0x9d8))(pTVar2->m_po_id,0x8b82,&local_98);
  dVar6 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar6,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1aee);
  if (local_98 != 1) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"Program linking failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x1af2);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (**(code **)(lVar1 + 0xb48))(pTVar2->m_po_id,"texture");
  iVar7 = (**(code **)(lVar1 + 0xb48))(pTVar2->m_po_id,"view");
  if (iVar3 == -1) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"\'texture\' uniform is considered inactive which is invalid",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x1afb);
  }
  else {
    if (iVar7 != -1) {
      (**(code **)(lVar1 + 0x1680))(pTVar2->m_po_id);
      dVar6 = (**(code **)(lVar1 + 0x800))();
      glu::checkError(dVar6,"glUseProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1b04);
      (**(code **)(lVar1 + 0x14f0))(iVar3,pTVar2->m_texture_unit_for_parent_texture - 0x84c0);
      (**(code **)(lVar1 + 0x14f0))(iVar7,pTVar2->m_texture_unit_for_view_texture - 0x84c0);
      dVar6 = (**(code **)(lVar1 + 0x800))();
      glu::checkError(dVar6,"glUniform1i() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x1b08);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0],local_78[0] + 1);
      }
      return;
    }
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"\'view\' uniform is considered inactive which is invalid",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x1b00);
  }
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureViewTestViewClasses::initProgramObject(glw::GLenum texture_internalformat, glw::GLenum view_internalformat)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Determine which samplers we should be using for sampling both textures */
	const unsigned int texture_n_components =
		TextureViewUtilities::getAmountOfComponentsForInternalformat(texture_internalformat);
	const _sampler_type texture_sampler_type =
		TextureViewUtilities::getSamplerTypeForInternalformat(texture_internalformat);
	const char* texture_sampler_data_type_glsl =
		TextureViewUtilities::getGLSLDataTypeForSamplerType(texture_sampler_type, texture_n_components);
	const char* texture_sampler_glsl = TextureViewUtilities::getGLSLTypeForSamplerType(texture_sampler_type);
	const char* texture_swizzle_glsl =
		(texture_n_components == 4) ? "xyzw" :
									  (texture_n_components == 3) ? "xyz" : (texture_n_components == 2) ? "xy" : "x";
	const unsigned int view_n_components =
		TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);
	const _sampler_type view_sampler_type = TextureViewUtilities::getSamplerTypeForInternalformat(view_internalformat);
	const char*			view_sampler_data_type_glsl =
		TextureViewUtilities::getGLSLDataTypeForSamplerType(view_sampler_type, view_n_components);
	const char* view_sampler_glsl = TextureViewUtilities::getGLSLTypeForSamplerType(view_sampler_type);
	const char* view_swizzle_glsl =
		(view_n_components == 4) ? "xyzw" : (view_n_components == 3) ? "xyz" : (view_n_components == 2) ? "xy" : "x";

	/* Form vertex shader body */
	const char* token_texture_data_type = "TEXTURE_DATA_TYPE";
	const char* token_texture_sampler   = "TEXTURE_SAMPLER";
	const char* token_texture_swizzle   = "TEXTURE_SWIZZLE";
	const char* token_view_data_type	= "VIEW_DATA_TYPE";
	const char* token_view_sampler		= "VIEW_SAMPLER";
	const char* token_view_swizzle		= "VIEW_SWIZZLE";
	const char* vs_template_body		= "#version 400\n"
								   "\n"
								   "uniform TEXTURE_SAMPLER texture;\n"
								   "uniform VIEW_SAMPLER    view;\n"
								   "\n"
								   "out TEXTURE_DATA_TYPE out_texture_data;\n"
								   "out VIEW_DATA_TYPE    out_view_data;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    ivec2 uv = ivec2(gl_VertexID % 4,\n"
								   "                     gl_VertexID / 4);\n"
								   "\n"
								   "    out_texture_data = texelFetch(texture, uv, 0).TEXTURE_SWIZZLE;\n"
								   "    out_view_data    = texelFetch(view,    uv, 0).VIEW_SWIZZLE;\n"
								   "}\n";

	std::size_t token_position = std::string::npos;
	std::string vs_body		   = vs_template_body;

	while ((token_position = vs_body.find(token_texture_data_type)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_texture_data_type), texture_sampler_data_type_glsl);
	}

	while ((token_position = vs_body.find(token_texture_sampler)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_texture_sampler), texture_sampler_glsl);
	}

	while ((token_position = vs_body.find(token_texture_swizzle)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_texture_swizzle), texture_swizzle_glsl);
	}

	while ((token_position = vs_body.find(token_view_data_type)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_view_data_type), view_sampler_data_type_glsl);
	}

	while ((token_position = vs_body.find(token_view_sampler)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_view_sampler), view_sampler_glsl);
	}

	while ((token_position = vs_body.find(token_view_swizzle)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_view_swizzle), view_swizzle_glsl);
	}

	/* Compile the shader */
	glw::GLint  compile_status  = GL_FALSE;
	const char* vs_body_raw_ptr = vs_body.c_str();

	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body_raw_ptr, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	gl.compileShader(m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status != GL_TRUE)
	{
		TCU_FAIL("Shader compilation failed");
	}

	/* Configure test program object for XFB */
	const char*		   varying_names[] = { "out_texture_data", "out_view_data" };
	const unsigned int n_varying_names = sizeof(varying_names) / sizeof(varying_names[0]);

	gl.transformFeedbackVaryings(m_po_id, n_varying_names, varying_names, GL_SEPARATE_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

	/* Configure buffer object bindings for XFB */
	gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index for 'out_texture_data' */
					   m_bo_id, 0,						/* offset */
					   m_view_data_offset);				/* size */
	gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 1, /* index for 'out_view_data' */
					   m_bo_id, m_view_data_offset,		/* offset */
					   m_bo_size - m_view_data_offset); /* size */

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() call(s) failed.");

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed.");
	}

	/* Configure sampler uniforms */
	glw::GLint texture_uniform_location = gl.getUniformLocation(m_po_id, "texture");
	glw::GLint view_uniform_location	= gl.getUniformLocation(m_po_id, "view");

	if (texture_uniform_location == -1)
	{
		TCU_FAIL("'texture' uniform is considered inactive which is invalid");
	}

	if (view_uniform_location == -1)
	{
		TCU_FAIL("'view' uniform is considered inactive which is invalid");
	}

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.uniform1i(texture_uniform_location, m_texture_unit_for_parent_texture - GL_TEXTURE0);
	gl.uniform1i(view_uniform_location, m_texture_unit_for_view_texture - GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call(s) failed.");
}